

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O0

interval_t duckdb::ToQuartersOperator::Operation<int,duckdb::interval_t>(int input)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  int iinput;
  interval_t result;
  allocator local_39;
  string local_38 [12];
  int in_stack_ffffffffffffffd4;
  string *in_stack_ffffffffffffffd8;
  OutOfRangeException *in_stack_ffffffffffffffe0;
  uint local_10 [4];
  
  iVar2 = Cast::Operation<int,int>(in_stack_ffffffffffffffd4);
  bVar1 = duckdb::TryMultiplyOperator::Operation<int,int,int>(iVar2,3,(int *)local_10);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Interval value %d quarters out of range",&local_39);
    OutOfRangeException::OutOfRangeException<int>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    __cxa_throw(uVar3,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  return (interval_t)ZEXT416(local_10[0]);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_QUARTER,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %d quarters out of range", input);
		}
		result.days = 0;
		result.micros = 0;
		return result;
	}